

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkPartitionSmart(Abc_Ntk_t *pNtk,int nSuppSizeLimit,int fVerbose)

{
  int iVar1;
  int i;
  abctime aVar2;
  Vec_Ptr_t *p;
  abctime aVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p_00;
  ProgressBar *p_01;
  char *p_02;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  uint *pBuffer;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  Vec_Ptr_t *vPartsAll;
  Vec_Ptr_t *pVVar11;
  Abc_Ntk_t *pAVar12;
  
  aVar2 = Abc_Clock();
  pAVar12 = pNtk;
  p = Abc_NtkComputeSupportsSmart(pNtk);
  iVar1 = (int)pAVar12;
  if (fVerbose != 0) {
    Abc_Print(iVar1,"%s =","Supps");
    aVar3 = Abc_Clock();
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  pVVar4 = Vec_PtrAlloc(1000);
  aVar2 = Abc_Clock();
  pVVar5 = Vec_PtrAlloc(0x100);
  p_00 = Vec_PtrAlloc(0x100);
  uVar10 = p->nSize;
  p_02 = (char *)(ulong)uVar10;
  p_01 = Extra_ProgressBarStart(_stdout,uVar10);
  pVVar11 = (Vec_Ptr_t *)0x0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  while (uVar9 = (uint)pVVar11, uVar10 != uVar9) {
    vPartsAll = pVVar11;
    p_02 = (char *)Vec_PtrEntry(p,uVar9);
    if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= (int)uVar9)) {
      Extra_ProgressBarUpdate_int(p_01,uVar9,(char *)0x0);
      vPartsAll = pVVar11;
    }
    iVar1 = Vec_IntPop((Vec_Int_t *)p_02);
    Abc_Clock();
    i = Abc_NtkPartitionSmartFindPart(p_00,vPartsAll,pVVar4,nSuppSizeLimit,(Vec_Int_t *)p_02);
    Abc_Clock();
    if (i == -1) {
      pVVar6 = Vec_IntAlloc(0x20);
      Vec_IntPush(pVVar6,iVar1);
      pVVar7 = Vec_IntDup((Vec_Int_t *)p_02);
      Vec_PtrPush(pVVar5,pVVar6);
      Vec_PtrPush(p_00,pVVar7);
      p_02 = (char *)Abc_NtkSuppCharStart((Vec_Int_t *)p_02,pNtk->vCis->nSize);
      Vec_PtrPush(pVVar4,p_02);
    }
    else {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(pVVar5,i);
      Vec_IntPush(pVVar6,iVar1);
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,i);
      pVVar7 = Vec_IntTwoMerge(pVVar6,(Vec_Int_t *)p_02);
      Vec_IntFree(pVVar6);
      Vec_PtrWriteEntry(p_00,i,pVVar7);
      pBuffer = (uint *)Vec_PtrEntry(pVVar4,i);
      Abc_NtkSuppCharAdd(pBuffer,(Vec_Int_t *)p_02,pNtk->vCis->nSize);
    }
    pVVar11 = (Vec_Ptr_t *)(ulong)(uVar9 + 1);
  }
  Extra_ProgressBarStop(p_01);
  uVar10 = pVVar4->nSize;
  uVar9 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    p_02 = (char *)(ulong)uVar9;
    pvVar8 = Vec_PtrEntry(pVVar4,uVar9);
    free(pvVar8);
  }
  Vec_PtrFree(pVVar4);
  iVar1 = (int)pVVar4;
  if (fVerbose != 0) {
    Abc_Print(iVar1,"%s =","Parts");
    aVar3 = Abc_Clock();
    p_02 = "%9.2f sec\n";
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  aVar2 = Abc_Clock();
  uVar10 = p_00->nSize;
  uVar9 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,uVar9);
    p_02 = (char *)(ulong)uVar9;
    Vec_IntPush(pVVar6,uVar9);
  }
  Vec_VecSort((Vec_Vec_t *)p_00,(int)p_02);
  pVVar4 = Vec_PtrAlloc(0x100);
  for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,uVar9);
    iVar1 = Vec_IntPop(pVVar6);
    pvVar8 = Vec_PtrEntry(pVVar5,iVar1);
    Vec_PtrPush(pVVar4,pvVar8);
  }
  Vec_PtrFree(pVVar5);
  pVVar5 = pVVar4;
  Abc_NtkPartitionCompact(pVVar4,p_00,nSuppSizeLimit);
  iVar1 = (int)pVVar5;
  if (fVerbose != 0) {
    Abc_Print(iVar1,"%s =","Comps");
    aVar3 = Abc_Clock();
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
    printf("Created %d partitions.\n",(ulong)(uint)pVVar4->nSize);
  }
  Vec_VecFree((Vec_Vec_t *)p);
  Vec_VecFree((Vec_Vec_t *)p_00);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nSuppSizeLimit, int fVerbose )
{
    ProgressBar * pProgress;
    Vec_Ptr_t * vPartSuppsChar;
    Vec_Ptr_t * vSupps, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut, timeFind = 0;
    abctime clk, clk2;

    // compute the supports for all outputs
clk = Abc_Clock();
//    vSupps = Abc_NtkComputeSupportsNaive( pNtk );
    vSupps = Abc_NtkComputeSupportsSmart( pNtk );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsChar = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
//        if ( i % 1000 == 0 )
//            printf( "CIs = %6d. COs = %6d. Processed = %6d (out of %6d). Parts = %6d.\r", 
//                Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), i, Vec_PtrSize(vSupps), Vec_PtrSize(vPartsAll) ); 
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
clk2 = Abc_Clock();
        iPart = Abc_NtkPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsChar, nSuppSizeLimit, vOne );
timeFind += Abc_Clock() - clk2;
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsChar, Abc_NtkSuppCharStart(vOne, Abc_NtkCiNum(pNtk)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Abc_NtkSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsChar, iPart), vOne, Abc_NtkCiNum(pNtk) );
        }
    }
    Extra_ProgressBarStop( pProgress );

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsChar, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsChar );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
//ABC_PRT( "Find ", timeFind );
}

clk = Abc_Clock();
    // remember number of supports
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );
    Abc_NtkPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );

if ( fVerbose )
{
ABC_PRT( "Comps", Abc_Clock() - clk );
}
    if ( fVerbose )
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Abc_NtkCo(pNtk, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}